

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

png_uint_32
png_colormap_compose
          (png_image_read_control *display,png_uint_32 foreground,int foreground_encoding,
          png_uint_32 alpha,png_uint_32 background,int encoding)

{
  uint uVar1;
  uint uVar2;
  uint local_28;
  png_uint_32 b;
  png_uint_32 f;
  int encoding_local;
  png_uint_32 background_local;
  png_uint_32 alpha_local;
  int foreground_encoding_local;
  png_uint_32 foreground_local;
  png_image_read_control *display_local;
  
  uVar1 = decode_gamma(display,foreground,foreground_encoding);
  uVar2 = decode_gamma(display,background,encoding);
  uVar1 = uVar1 * alpha + uVar2 * (0xff - alpha);
  if (encoding == 2) {
    local_28 = (uVar1 * 0x101 >> 0x10) + uVar1 * 0x101 + 0x8000 >> 0x10;
  }
  else {
    local_28 = (uint)png_sRGB_base[uVar1 >> 0xf] +
               ((uVar1 & 0x7fff) * (uint)png_sRGB_delta[uVar1 >> 0xf] >> 0xc) >> 8 & 0xff;
  }
  return local_28;
}

Assistant:

static png_uint_32
png_colormap_compose(png_image_read_control *display,
    png_uint_32 foreground, int foreground_encoding, png_uint_32 alpha,
    png_uint_32 background, int encoding)
{
   /* The file value is composed on the background, the background has the given
    * encoding and so does the result, the file is encoded with P_FILE and the
    * file and alpha are 8-bit values.  The (output) encoding will always be
    * P_LINEAR or P_sRGB.
    */
   png_uint_32 f = decode_gamma(display, foreground, foreground_encoding);
   png_uint_32 b = decode_gamma(display, background, encoding);

   /* The alpha is always an 8-bit value (it comes from the palette), the value
    * scaled by 255 is what PNG_sRGB_FROM_LINEAR requires.
    */
   f = f * alpha + b * (255-alpha);

   if (encoding == P_LINEAR)
   {
      /* Scale to 65535; divide by 255, approximately (in fact this is extremely
       * accurate, it divides by 255.00000005937181414556, with no overflow.)
       */
      f *= 257; /* Now scaled by 65535 */
      f += f >> 16;
      f = (f+32768) >> 16;
   }

   else /* P_sRGB */
      f = PNG_sRGB_FROM_LINEAR(f);

   return f;
}